

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

int read_decorr_terms(WavpackStream *wps,WavpackMetadata *wpmd)

{
  decorr_pass *dpp;
  uchar *byteptr;
  int termcnt;
  WavpackMetadata *wpmd_local;
  WavpackStream *wps_local;
  int local_4;
  
  termcnt = wpmd->byte_length;
  byteptr = (uchar *)wpmd->data;
  if (termcnt < 0x11) {
    wps->num_terms = termcnt;
    dpp = (decorr_pass *)((long)(wps->w).c + (long)termcnt * 0x48 + -8);
    while (termcnt != 0) {
      dpp->term = (*byteptr & 0x1f) - 5;
      dpp->delta = (short)((int)(uint)*byteptr >> 5);
      if ((((dpp->term == 0) || (dpp->term < -3)) || ((8 < dpp->term && (dpp->term < 0x11)))) ||
         (0x12 < dpp->term)) {
        return 0;
      }
      dpp = dpp + -1;
      byteptr = byteptr + 1;
      termcnt = termcnt + -1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int read_decorr_terms (WavpackStream *wps, WavpackMetadata *wpmd)
{
    int termcnt = wpmd->byte_length;
    uchar *byteptr = wpmd->data;
    struct decorr_pass *dpp;

    if (termcnt > MAX_NTERMS)
        return FALSE;

    wps->num_terms = termcnt;

    for (dpp = wps->decorr_passes + termcnt - 1; termcnt--; dpp--) {
        dpp->term = (int)(*byteptr & 0x1f) - 5;
        dpp->delta = (*byteptr++ >> 5) & 0x7;

        if (!dpp->term || dpp->term < -3 || (dpp->term > MAX_TERM && dpp->term < 17) || dpp->term > 18)
            return FALSE;
    }

    return TRUE;
}